

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_adaptive.cpp
# Opt level: O3

void __thiscall
so_5::impl::adaptive_subscr_storage::storage_t::storage_t
          (storage_t *this,agent_t *owner,size_t threshold,
          subscription_storage_unique_ptr_t *small_storage,
          subscription_storage_unique_ptr_t *large_storage)

{
  subscription_storage_t::subscription_storage_t(&this->super_subscription_storage_t,owner);
  (this->super_subscription_storage_t)._vptr_subscription_storage_t =
       (_func_int **)&PTR__storage_t_00285e58;
  this->m_threshold = threshold;
  (this->m_small_storage)._M_t.
  super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
  .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl =
       (small_storage->_M_t).
       super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
       .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl;
  (small_storage->_M_t).
  super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
  .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl =
       (subscription_storage_t *)0x0;
  (this->m_large_storage)._M_t.
  super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
  .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl =
       (large_storage->_M_t).
       super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
       .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl;
  (large_storage->_M_t).
  super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
  .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl =
       (subscription_storage_t *)0x0;
  this->m_current_storage =
       (this->m_small_storage)._M_t.
       super___uniq_ptr_impl<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::impl::subscription_storage_t_*,_std::default_delete<so_5::impl::subscription_storage_t>_>
       .super__Head_base<0UL,_so_5::impl::subscription_storage_t_*,_false>._M_head_impl;
  return;
}

Assistant:

storage_t::storage_t(
	agent_t * owner,
	std::size_t threshold,
	subscription_storage_unique_ptr_t small_storage,
	subscription_storage_unique_ptr_t large_storage )
	:	subscription_storage_t( owner )
	,	m_threshold( threshold )
	,	m_small_storage( std::move( small_storage ) )
	,	m_large_storage( std::move( large_storage ) )
	{
		m_current_storage = m_small_storage.get();
	}